

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void whitespace_suite::test_newlines(void)

{
  char input [3];
  decoder_type decoder;
  value_type local_144 [4];
  undefined4 local_140;
  value local_13c;
  basic_decoder<char> local_138;
  
  local_144[2] = '\0';
  local_144[0] = '\n';
  local_144[1] = '\n';
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<3ul>
            (&local_138,(value_type (*) [3])local_144);
  local_13c = local_138.current.code;
  local_140 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0xb6,"void whitespace_suite::test_newlines()",&local_13c,&local_140);
  return;
}

Assistant:

void test_newlines()
{
    const char input[] = "\n\n";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}